

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O1

Task * AI::create_MoveToPlayer(void)

{
  pointer *ppRVar1;
  iterator __position;
  Task *in_RDI;
  RequiredValue local_44;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"moveToPlayer","");
  Task::Task(in_RDI,&local_38,Simple);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  in_RDI->action = MoveToPlayer;
  local_44.id = Alertness;
  local_44.op = GreaterEqual;
  local_44.value = 80.0;
  __position._M_current =
       (in_RDI->preconditions).requiredValues.
       super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (in_RDI->preconditions).requiredValues.
      super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>::
    _M_realloc_insert<AI::RequiredValue>
              (&(in_RDI->preconditions).requiredValues,__position,&local_44);
  }
  else {
    (__position._M_current)->value = 80.0;
    (__position._M_current)->id = Alertness;
    (__position._M_current)->op = GreaterEqual;
    ppRVar1 = &(in_RDI->preconditions).requiredValues.
               super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppRVar1 = *ppRVar1 + 1;
  }
  local_44._0_5_ = 0x100000003;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::emplace_back<AI::RequiredFlag>
            ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)in_RDI,
             (RequiredFlag *)&local_44);
  local_44.id = Alertness;
  local_44.op = ~LessThan;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  emplace_back<AI::SatisfiablePredicateParams>
            (&(in_RDI->postconditions).satisfiedPredicates,(SatisfiablePredicateParams *)&local_44);
  return in_RDI;
}

Assistant:

Task create_MoveToPlayer()
	{
		Task move {"moveToPlayer"};
		move.action = Action::MoveToPlayer;
		move.preconditions.requiredValues.push_back({WorldStateIdentifier::Alertness, ConditionOp::GreaterEqual, 80.f});
		move.preconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, true});
		
		move.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearPlayer, -1});

		return move;
	}